

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scoped_ptr.hpp
# Opt level: O3

void __thiscall
asio::detail::scoped_ptr<asio::detail::posix_thread>::reset
          (scoped_ptr<asio::detail::posix_thread> *this,posix_thread *p)

{
  posix_thread *ppVar1;
  
  ppVar1 = this->p_;
  if ((ppVar1 != (posix_thread *)0x0) && (ppVar1->joined_ == false)) {
    pthread_detach(ppVar1->thread_);
  }
  operator_delete(ppVar1);
  this->p_ = p;
  return;
}

Assistant:

void reset(T* p = 0)
  {
    delete p_;
    p_ = p;
  }